

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deadline_timer_service.hpp
# Opt level: O0

size_t __thiscall
asio::detail::
deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
::expires_at(deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
             *this,implementation_type *impl,time_type *expiry_time,error_code *ec)

{
  size_t sVar1;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  error_code *in_stack_00000008;
  size_t count;
  undefined8 local_38;
  error_code *in_stack_ffffffffffffffd0;
  
  sVar1 = cancel((deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
                  *)ec,(implementation_type *)count,in_stack_00000008);
  *in_RSI = *in_RDX;
  std::error_code::error_code(in_stack_ffffffffffffffd0);
  *in_RCX = local_38;
  in_RCX[1] = in_stack_ffffffffffffffd0;
  return sVar1;
}

Assistant:

std::size_t expires_at(implementation_type& impl,
      const time_type& expiry_time, asio::error_code& ec)
  {
    std::size_t count = cancel(impl, ec);
    impl.expiry = expiry_time;
    ec = asio::error_code();
    return count;
  }